

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedMemory.cpp
# Opt level: O3

int __thiscall SharedMemory::init(SharedMemory *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  __uid_t _Var3;
  uint in_ECX;
  int in_EDX;
  int iVar4;
  size_t __size;
  shmid_ds *psVar5;
  shmid_ds local_98;
  
  iVar4 = (int)ctx;
  if (iVar4 == -1) {
LAB_00160c8b:
    iVar4 = 0;
  }
  else {
    psVar5 = (shmid_ds *)(ulong)in_ECX;
    __size = (size_t)in_EDX;
    iVar2 = 0x600;
    if (in_ECX == 0) {
      iVar2 = 0;
    }
    iVar2 = shmget(iVar4,__size,iVar2);
    this->mShm = iVar2;
    if (in_ECX == 2 && iVar2 == -1) {
      iVar2 = shmget(iVar4,__size,0);
      this->mShm = iVar2;
      if (iVar2 == -1) {
        return 0;
      }
      shmctl(iVar2,0,(shmid_ds *)0x0);
      iVar2 = shmget(iVar4,__size,0x600);
      this->mShm = iVar2;
      if (iVar2 == -1) {
        return 0;
      }
LAB_00160c3a:
      local_98.__unused4 = 0;
      local_98.__unused5 = 0;
      local_98.shm_cpid = 0;
      local_98.shm_lpid = 0;
      local_98.shm_nattch = 0;
      local_98.shm_dtime = 0;
      local_98.shm_ctime = 0;
      local_98.shm_segsz = 0;
      local_98.shm_atime = 0;
      local_98.shm_perm.__unused1 = 0;
      local_98.shm_perm.__unused2 = 0;
      local_98.shm_perm.cgid = 0;
      local_98.shm_perm.mode = 0;
      local_98.shm_perm.__pad1 = 0;
      local_98.shm_perm.__seq = 0;
      local_98.shm_perm.__pad2 = 0;
      local_98.shm_perm._28_4_ = 0;
      local_98.shm_perm.__key = 0;
      local_98.shm_perm.uid = 0;
      local_98.shm_perm.gid = 0;
      local_98.shm_perm.cuid = 0;
      _Var3 = getuid();
      local_98.shm_perm.uid = _Var3;
      local_98.shm_perm._20_4_ = 0x380;
      iVar2 = shmctl(this->mShm,1,&local_98);
      if (iVar2 == -1) {
        shmctl(this->mShm,0,(shmid_ds *)0x0);
        this->mShm = -1;
        return 0;
      }
      bVar1 = true;
      psVar5 = &local_98;
    }
    else {
      if (iVar2 == -1) goto LAB_00160c8b;
      if (in_ECX != 0) goto LAB_00160c3a;
      bVar1 = false;
    }
    this->mKey = iVar4;
    this->mOwner = bVar1;
    this->mSize = in_EDX;
    iVar4 = (int)CONCAT71((int7)((ulong)psVar5 >> 8),1);
  }
  return iVar4;
}

Assistant:

bool SharedMemory::init(key_t key, int size, CreateMode mode)
{
    if (key == -1)
        return false;

    mShm = shmget(key, size, (mode == None ? 0 : (IPC_CREAT | IPC_EXCL)));
    if (mShm == -1 && mode == Recreate) {
        mShm = shmget(key, size, 0);
        if (mShm != -1) {
            shmctl(mShm, IPC_RMID, 0);
            mShm = shmget(key, size, IPC_CREAT | IPC_EXCL);
        }
    }
    if (mShm == -1)
        return false;

    if (mode != None) {
        shmid_ds ds;
        memset(&ds, 0, sizeof(ds));
        ds.shm_perm.uid = getuid();
        ds.shm_perm.mode = 0600;
#ifdef HAVE_SHMDEST
        ds.shm_perm.mode |= SHM_DEST;
#endif
        const int ret = shmctl(mShm, IPC_SET, &ds);
        if (ret == -1) {
            shmctl(mShm, IPC_RMID, 0);
            mShm = -1;
            return false;
        }
    }
    mKey = key;
    mOwner = (mode != None);
    mSize = size;

    return true;
}